

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multistream.h
# Opt level: O3

void __thiscall ipx::Multistream::~Multistream(Multistream *this)

{
  void *pvVar1;
  
  (this->super_ostream)._vptr_basic_ostream = (_func_int **)&PTR__Multistream_00440b28;
  *(undefined ***)&(this->super_ostream).field_0x60 = &PTR__Multistream_00440b50;
  *(undefined ***)&(this->super_ostream).field_0x8 = &PTR__multibuffer_00440b88;
  pvVar1 = *(void **)&(this->super_ostream).field_0x48;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1);
  }
  *(code **)&(this->super_ostream).field_0x8 = std::istream::_M_extract<double>;
  std::locale::~locale((locale *)&(this->super_ostream).field_0x40);
  std::ios_base::~ios_base((ios_base *)&(this->super_ostream).field_0x60);
  operator_delete(this);
  return;
}

Assistant:

Multistream() : std::ostream(nullptr) {
        std::ostream::rdbuf(&mbuffer_);
    }